

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int trex_newnode(TRex *exp,TRexNodeType type)

{
  int iVar1;
  int iVar2;
  TRexNode *pTVar3;
  int iVar4;
  
  iVar4 = -1;
  if (type == 0x102) {
    iVar4 = exp->_nsubexpr;
    exp->_nsubexpr = iVar4 + 1;
  }
  iVar1 = exp->_nallocated;
  iVar2 = exp->_nsize;
  if (iVar2 < iVar1) {
    pTVar3 = exp->_nodes;
  }
  else {
    exp->_nallocated = iVar1 * 2;
    pTVar3 = (TRexNode *)realloc(exp->_nodes,(long)iVar1 * 0x20 + (ulong)((long)iVar1 * 0x20 == 0));
    if (pTVar3 == (TRexNode *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    exp->_nodes = pTVar3;
    iVar2 = exp->_nsize;
  }
  exp->_nsize = iVar2 + 1;
  pTVar3[iVar2].type = type;
  pTVar3[iVar2].left = -1;
  pTVar3[iVar2].right = iVar4;
  pTVar3[iVar2].next = -1;
  return exp->_nsize + -1;
}

Assistant:

static int trex_newnode(TRex* exp, TRexNodeType type) {
    TRexNode n;
    int newid;
    n.type = type;
    n.next = n.right = n.left = -1;
    if (type == OP_EXPR)
        n.right = exp->_nsubexpr++;
    if (exp->_nallocated < (exp->_nsize + 1)) {
        exp->_nallocated *= 2;
        exp->_nodes = (TRexNode*)xrealloc(exp->_nodes, (size_t)exp->_nallocated * sizeof(TRexNode));
    }
    exp->_nodes[exp->_nsize++] = n;
    newid = exp->_nsize - 1;
    return (int)newid;
}